

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O2

void pty_special(Backend *be,SessionSpecialCode code,int arg)

{
  int iVar1;
  int iVar2;
  
  if (code == SS_EOF) {
    if ((-1 < *(int *)&be[-0x107].interactor) &&
       (*(int *)&be[-0x107].interactor != *(int *)&be[-0x10c].interactor)) {
      *(undefined1 *)&be[-1].interactor = 1;
      pty_try_write((Pty *)(be + -0x10c));
      return;
    }
  }
  else if (code == SS_BRK) {
    if (-1 < *(int *)&be[-0x10c].interactor) {
      tcsendbreak(*(int *)&be[-0x10c].interactor,0);
      return;
    }
  }
  else {
    iVar2 = 0xf;
    if (code != SS_SIGTERM) {
      iVar2 = (uint)(code == SS_SIGINT) * 3 + -1;
    }
    iVar1 = 9;
    if (code != SS_SIGKILL) {
      iVar1 = iVar2;
    }
    iVar2 = 3;
    if (code != SS_SIGQUIT) {
      iVar2 = iVar1;
    }
    iVar1 = 1;
    if (code != SS_SIGHUP) {
      iVar1 = iVar2;
    }
    iVar2 = 6;
    if (code != SS_SIGABRT) {
      iVar2 = iVar1;
    }
    iVar1 = 0xe;
    if (code != SS_SIGALRM) {
      iVar1 = iVar2;
    }
    iVar2 = 8;
    if (code != SS_SIGFPE) {
      iVar2 = iVar1;
    }
    iVar1 = 4;
    if (code != SS_SIGILL) {
      iVar1 = iVar2;
    }
    iVar2 = 0xd;
    if (code != SS_SIGPIPE) {
      iVar2 = iVar1;
    }
    iVar1 = 0xb;
    if (code != SS_SIGSEGV) {
      iVar1 = iVar2;
    }
    iVar2 = 10;
    if (code != SS_SIGUSR1) {
      iVar2 = iVar1;
    }
    iVar1 = 0xc;
    if (code != SS_SIGUSR2) {
      iVar1 = iVar2;
    }
    if ((iVar1 != -1) && (*(char *)((long)&be[-4].vt + 4) == '\0')) {
      kill(*(__pid_t *)&be[-5].interactor,iVar1);
      return;
    }
  }
  return;
}

Assistant:

static void pty_special(Backend *be, SessionSpecialCode code, int arg)
{
    Pty *pty = container_of(be, Pty, backend);

    if (code == SS_BRK) {
        if (pty->master_fd >= 0)
            tcsendbreak(pty->master_fd, 0);
        return;
    }

    if (code == SS_EOF) {
        if (pty->master_i >= 0 && pty->master_i != pty->master_fd) {
            pty->pending_eof = true;
            pty_try_write(pty);
        }
        return;
    }

    {
        int sig = -1;

        #define SIGNAL_SUB(name) if (code == SS_SIG ## name) sig = SIG ## name;
        #define SIGNAL_MAIN(name, text) SIGNAL_SUB(name)
        #define SIGNALS_LOCAL_ONLY
        #include "ssh/signal-list.h"
        #undef SIGNAL_SUB
        #undef SIGNAL_MAIN
        #undef SIGNALS_LOCAL_ONLY

        if (sig != -1) {
            if (!pty->child_dead)
                kill(pty->child_pid, sig);
            return;
        }
    }

    return;
}